

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int target_width,int target_height,
                Allocator *allocator)

{
  short in_DX;
  Mat *in_RDI;
  int type_from;
  int in_stack_00000128;
  int in_stack_0000012c;
  int in_stack_00000130;
  int in_stack_00000134;
  uchar *in_stack_00000138;
  int in_stack_00000150;
  int in_stack_00000158;
  Allocator *in_stack_00000160;
  
  if ((in_DX == 1) || (in_DX == 2)) {
    from_pixels_resize(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,
                       in_stack_00000128,in_stack_00000150,in_stack_00000158,in_stack_00000160);
  }
  else if (in_DX == 3) {
    from_pixels_resize(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,
                       in_stack_00000128,in_stack_00000150,in_stack_00000158,in_stack_00000160);
  }
  else if (in_DX == 4) {
    from_pixels_resize(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,
                       in_stack_00000128,in_stack_00000150,in_stack_00000158,in_stack_00000160);
  }
  else {
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int target_width, int target_height, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 3, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 1, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 4, target_width, target_height, allocator);
    }

    // unknown convert type
    return Mat();
}